

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t shift_bitmap(_Bool shift,_Bool ctrl,_Bool alt,_Bool *consumed_alt)

{
  wchar_t wVar1;
  int iVar2;
  
  if (consumed_alt != (_Bool *)0x0 && alt) {
    *consumed_alt = true;
  }
  iVar2 = (uint)shift + (uint)ctrl * 4;
  wVar1 = iVar2 + 1 + (uint)alt * 2;
  if (iVar2 + (uint)alt * 2 == 0) {
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int shift_bitmap(bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    int bitmap = (shift ? 1 : 0) + (alt ? 2 : 0) + (ctrl ? 4 : 0);
    if (bitmap)
        bitmap++;
    if (alt && consumed_alt)
        *consumed_alt = true;
    return bitmap;
}